

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_parameter_validation.cpp
# Opt level: O0

ze_result_t __thiscall
validation_layer::ZETParameterValidation::zetDebugReadMemoryPrologue
          (ZETParameterValidation *this,zet_debug_session_handle_t hDebug,ze_device_thread_t thread,
          zet_debug_memory_space_desc_t *desc,size_t size,void *buffer)

{
  size_t size_local;
  zet_debug_memory_space_desc_t *desc_local;
  zet_debug_session_handle_t hDebug_local;
  ZETParameterValidation *this_local;
  ze_device_thread_t thread_local;
  
  if (hDebug == (zet_debug_session_handle_t)0x0) {
    thread_local.eu = 0x78000005;
  }
  else if (desc == (zet_debug_memory_space_desc_t *)0x0) {
    thread_local.eu = 0x78000007;
  }
  else if (buffer == (void *)0x0) {
    thread_local.eu = 0x78000007;
  }
  else if ((int)desc->type < 3) {
    thread_local.eu =
         ParameterValidation::validateExtensions<_zet_debug_memory_space_desc_t_const*>(desc);
  }
  else {
    thread_local.eu = 0x7800000c;
  }
  return thread_local.eu;
}

Assistant:

ze_result_t
    ZETParameterValidation::zetDebugReadMemoryPrologue(
        zet_debug_session_handle_t hDebug,              ///< [in] debug session handle
        ze_device_thread_t thread,                      ///< [in] the thread identifier.
        const zet_debug_memory_space_desc_t* desc,      ///< [in] memory space descriptor
        size_t size,                                    ///< [in] the number of bytes to read
        void* buffer                                    ///< [in,out] a buffer to hold a copy of the memory
        )
    {
        if( nullptr == hDebug )
            return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;

        if( nullptr == desc )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        if( nullptr == buffer )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        if( ZET_DEBUG_MEMORY_SPACE_TYPE_ELF < desc->type )
            return ZE_RESULT_ERROR_INVALID_ENUMERATION;

        return ParameterValidation::validateExtensions(desc);
    }